

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::XmlReporter::testCaseStarting(XmlReporter *this,TestCaseInfo *testInfo)

{
  int iVar1;
  XmlWriter *attribute;
  element_type *peVar2;
  TestCaseInfo *in_RSI;
  XmlReporter *in_RDI;
  long in_FS_OFFSET;
  TestCaseInfo *in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  XmlFormatting in_stack_fffffffffffffec4;
  string *in_stack_fffffffffffffec8;
  allocator *paVar3;
  XmlWriter *in_stack_fffffffffffffed0;
  string *in_stack_fffffffffffffed8;
  XmlWriter *this_00;
  allocator local_ef;
  allocator local_ee;
  allocator local_ed [20];
  allocator local_d9;
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  string local_48 [32];
  string local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  StreamingReporterBase<Catch::XmlReporter>::testCaseStarting
            ((StreamingReporterBase<Catch::XmlReporter> *)
             CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),in_stack_fffffffffffffeb8
            );
  this_00 = &in_RDI->m_xml;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"TestCase",&local_d9);
  operator|(Newline,Indent);
  attribute = XmlWriter::startElement
                        (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                         in_stack_fffffffffffffec4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"name",local_ed);
  trim(in_stack_fffffffffffffed8);
  XmlWriter::writeAttribute(this_00,(string *)in_RDI,(string *)attribute);
  paVar3 = &local_ee;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"description",paVar3);
  XmlWriter::writeAttribute(this_00,(string *)in_RDI,(string *)attribute);
  paVar3 = &local_ef;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a8,"tags",paVar3);
  TestCaseInfo::tagsAsString_abi_cxx11_(in_RSI);
  XmlWriter::writeAttribute(this_00,(string *)in_RDI,(string *)attribute);
  std::__cxx11::string::~string(local_c8);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ef);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_ee);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)local_ed);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  writeSourceInfo(in_RDI,(SourceLineInfo *)attribute);
  peVar2 = clara::std::
           __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2557d9);
  iVar1 = (*(peVar2->super_NonCopyable)._vptr_NonCopyable[0xb])();
  if (iVar1 == 1) {
    Timer::start((Timer *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
  }
  XmlWriter::ensureTagClosed
            ((XmlWriter *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void XmlReporter::testCaseStarting( TestCaseInfo const& testInfo ) {
        StreamingReporterBase::testCaseStarting(testInfo);
        m_xml.startElement( "TestCase" )
            .writeAttribute( "name", trim( testInfo.name ) )
            .writeAttribute( "description", testInfo.description )
            .writeAttribute( "tags", testInfo.tagsAsString() );

        writeSourceInfo( testInfo.lineInfo );

        if ( m_config->showDurations() == ShowDurations::Always )
            m_testCaseTimer.start();
        m_xml.ensureTagClosed();
    }